

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTransaction::SetTxOutCommitment
          (ConfidentialTransaction *this,uint32_t index,ConfidentialAssetId *asset,
          ConfidentialValue *value,ConfidentialNonce *nonce,ByteData *surjection_proof,
          ByteData *range_proof)

{
  CfdException *this_00;
  ulong uVar1;
  undefined4 in_register_00000034;
  allocator local_e1;
  uint32_t local_e0;
  int ret;
  undefined1 local_d8 [32];
  ConfidentialValue *local_b8;
  ConfidentialAssetId *local_b0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_60;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  local_e0 = index;
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[0xc])
            (this,CONCAT44(in_register_00000034,index),0x8fa,"SetTxOutCommitment");
  local_b0 = asset;
  ConfidentialAssetId::GetData((ByteData *)local_d8,asset);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,
                     (ByteData *)local_d8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,&(value->data_).data_
            );
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,
                     (ByteData *)local_d8);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8,&(nonce->data_).data_
            );
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_78,
                     (ByteData *)local_d8);
  local_b8 = value;
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_d8);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_90,
                     surjection_proof);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,range_proof)
  ;
  uVar1 = (ulong)local_e0;
  ret = wally_tx_elements_output_commitment_set
                  ((wally_tx_output *)
                   (uVar1 * 0x70 +
                   *(long *)((long)(this->super_AbstractTransaction).wally_tx_pointer_ + 0x20)),
                   local_48._M_impl.super__Vector_impl_data._M_start,
                   (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_48._M_impl.super__Vector_impl_data._M_start,
                   local_60._M_impl.super__Vector_impl_data._M_start,
                   (long)local_60._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_60._M_impl.super__Vector_impl_data._M_start,
                   local_78._M_impl.super__Vector_impl_data._M_start,
                   (long)local_78._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78._M_impl.super__Vector_impl_data._M_start,
                   local_90._M_impl.super__Vector_impl_data._M_start,
                   (long)local_90._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_90._M_impl.super__Vector_impl_data._M_start,
                   local_a8._M_impl.super__Vector_impl_data._M_start,
                   (long)local_a8._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_a8._M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ConfidentialTxOut::SetCommitment
              ((this->vout_).
               super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar1,local_b0,local_b8,nonce,
               surjection_proof,range_proof);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a8);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_90);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_78);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_60);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    return;
  }
  local_d8._0_8_ = "cfdcore_elements_transaction.cpp";
  local_d8._8_4_ = 0x90a;
  local_d8._16_8_ = "SetTxOutCommitment";
  logger::warn<int&>((CfdSourceLocation *)local_d8,"wally_tx_elements_output_commitment_set NG[{}]."
                     ,&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_d8,"set commitment error.",&local_e1);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_d8);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::SetTxOutCommitment(
    uint32_t index, const ConfidentialAssetId &asset,
    const ConfidentialValue &value, const ConfidentialNonce &nonce,
    const ByteData &surjection_proof, const ByteData &range_proof) {
  CheckTxOutIndex(index, __LINE__, __FUNCTION__);

  const std::vector<uint8_t> &asset_data = asset.GetData().GetBytes();
  const std::vector<uint8_t> &value_data = value.GetData().GetBytes();
  const std::vector<uint8_t> &nonce_data = nonce.GetData().GetBytes();
  const std::vector<uint8_t> &surjection_data = surjection_proof.GetBytes();
  const std::vector<uint8_t> &range_data = range_proof.GetBytes();

  struct wally_tx *tx = static_cast<struct wally_tx *>(wally_tx_pointer_);
  int ret = wally_tx_elements_output_commitment_set(
      &tx->outputs[index], asset_data.data(), asset_data.size(),
      value_data.data(), value_data.size(), nonce_data.data(),
      nonce_data.size(), surjection_data.data(), surjection_data.size(),
      range_data.data(), range_data.size());
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_elements_output_commitment_set NG[{}].",
        ret);
    throw CfdException(kCfdIllegalStateError, "set commitment error.");
  }

  vout_[index].SetCommitment(
      asset, value, nonce, surjection_proof, range_proof);
}